

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  ZyanU16 ZVar1;
  undefined2 uVar2;
  ZydisMachineMode ZVar3;
  ZydisInstructionEncoding ZVar4;
  ZydisDecoderContext *pZVar5;
  byte *pbVar6;
  ZydisDecoderContext *pZVar7;
  ZydisDecoder *pZVar8;
  uint3 uVar9;
  ulong *puVar10;
  ZydisMnemonic *pZVar11;
  undefined8 *puVar12;
  byte bVar13;
  byte bVar14;
  ZyanBool ZVar15;
  ZyanU8 ZVar16;
  ushort uVar17;
  ZyanStatus ZVar18;
  ZyanStatus ZVar19;
  ZydisMaskMode ZVar20;
  ZydisOpcodeMap ZVar21;
  uint uVar22;
  ZydisInstructionDefinitionXOP *def;
  ZydisDecodedInstruction *pZVar23;
  ZydisDecoderTreeNode *pZVar24;
  ZyanU8 ZVar25;
  uint uVar26;
  ZydisDecoderTreeNode *pZVar27;
  ZyanU8 ZVar28;
  ZydisInstructionCategory ZVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  ZyanU8 *pZVar33;
  uint uVar34;
  uint uVar35;
  Elf64_Ehdr *pEVar36;
  ZydisBranchType ZVar37;
  ZyanUSize ZVar38;
  long lVar39;
  byte bVar40;
  ZydisInstructionAttributes ZVar41;
  undefined3 *puVar42;
  ulong uVar43;
  byte bVar44;
  undefined1 *puVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  Elf64_Ehdr *unaff_R12;
  byte bVar51;
  ZyanStatus status_047620348;
  uint uVar52;
  Elf64_Ehdr *pEVar53;
  Elf64_Ehdr *pEVar54;
  ZydisDecoderTreeNodeType ZVar55;
  ZydisDecoderTreeNode *node;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  ZyanU16 index;
  ZyanU8 prefix_bytes [4];
  ZydisDefinitionAccessedFlags *flags;
  ZydisInstructionEncodingInfo *info;
  ZyanU16 local_cc;
  bool local_c9;
  ZydisDecodedInstruction *local_c8;
  ZydisDecoderState *local_c0;
  ZyanBool local_b3;
  byte local_b2;
  byte local_b1;
  undefined8 local_b0;
  uint local_a4;
  byte local_9f;
  char local_9e;
  byte local_9d;
  uint local_9c;
  ZydisDecoderContext *local_98;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint local_6c;
  ulong local_68;
  ZyanU8 *local_60;
  ZyanU8 *local_58;
  ZyanU8 *local_50;
  ulong local_48;
  ZydisDefinitionAccessedFlags *local_40;
  Elf64_Ehdr *local_38;
  
  local_c0 = state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1243,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  local_58 = &(instruction->raw).evex.mmm;
  local_60 = &(instruction->raw).mvex.mmmm;
  local_50 = &(instruction->raw).vex.m_mmmm;
  node = &zydis_decoder_tree_root;
  local_48 = 0x401000000;
  pEVar36 = (Elf64_Ehdr *)instruction;
  pZVar24 = (ZydisDecoderTreeNode *)0x0;
  local_c8 = instruction;
  do {
    ZVar55 = node->type;
    local_cc = 0;
    ZVar16 = '|';
    pZVar27 = pZVar24;
    switch(ZVar55) {
    case '\0':
      if (pZVar24 == (ZydisDecoderTreeNode *)0x0) {
        iVar30 = 1;
        pZVar27 = (ZydisDecoderTreeNode *)0x0;
        unaff_R12 = (Elf64_Ehdr *)0x80200001;
      }
      else {
        ZVar16 = (local_c0->prefixes).mandatory_candidate;
        ZVar55 = '\f';
        iVar30 = 3;
        if ((ZVar16 != '\0') &&
           ((((ZydisDecodedInstruction *)pEVar36)->raw).prefixes
            [(local_c0->prefixes).offset_mandatory].type = ZYDIS_PREFIX_TYPE_IGNORED, ZVar16 == 'f')
           ) {
          bVar40 = (local_c0->prefixes).offset_mandatory;
          if ((local_c0->prefixes).offset_osz_override == bVar40) {
            (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[bVar40].type =
                 ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 5);
          *pbVar6 = *pbVar6 | 8;
        }
        pZVar27 = (ZydisDecoderTreeNode *)0x0;
        node = pZVar24;
      }
      goto LAB_0010a84c;
    case '\x01':
      if (((ZydisDecodedInstruction *)pEVar36)->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
LAB_001087c1:
        local_cc = 0;
      }
      else {
        if (((ZydisDecodedInstruction *)pEVar36)->encoding != ZYDIS_INSTRUCTION_ENCODING_XOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xddf,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xddb,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        bVar40 = (((ZydisDecodedInstruction *)pEVar36)->raw).xop.pp;
        local_cc = ((ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).xop.m_mmmm +
                   (ushort)bVar40 + (ushort)bVar40 * 2) - 7;
      }
      break;
    case '\x02':
      if (((ZydisDecodedInstruction *)pEVar36)->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY)
      goto LAB_001087c1;
      if (((ZydisDecodedInstruction *)pEVar36)->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS
         ) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdf3,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdef,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      local_cc = (ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).vex.m_mmmm +
                 (ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).vex.pp * 4 + 1;
      break;
    case '\x03':
      ZVar4 = ((ZydisDecodedInstruction *)pEVar36)->encoding;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe07,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        local_cc = (ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.mmmm +
                   (ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.pp * 4 + 0x21;
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
          if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xe0b,
                          "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                         );
          }
          goto LAB_001085fc;
        }
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe03,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        local_cc = (ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).evex.mmm +
                   (ushort)(((ZydisDecodedInstruction *)pEVar36)->raw).evex.pp * 8 + 1;
      }
      break;
    case '\x04':
      if (((ZydisDecodedInstruction *)pEVar36)->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        local_cc = 0xc;
      }
      else {
        if (((ZydisDecodedInstruction *)pEVar36)->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          bVar40 = ((ZydisDecodedInstruction *)pEVar36)->length;
          if (bVar40 < 0xf) {
            if (local_c0->buffer_len == 0) {
              pEVar53 = (Elf64_Ehdr *)0x80200000;
              goto LAB_00108c4e;
            }
            pZVar33 = local_c0->buffer;
            local_c0->buffer = pZVar33 + 1;
            ((ZydisDecodedInstruction *)pEVar36)->opcode = *pZVar33;
            ((ZydisDecodedInstruction *)pEVar36)->length = bVar40 + 1;
            local_c0->buffer_len = local_c0->buffer_len - 1;
            pEVar53 = &Elf64_Ehdr_00100000;
            bVar57 = true;
          }
          else {
            pEVar53 = (Elf64_Ehdr *)0x80200002;
LAB_00108c4e:
            bVar57 = false;
          }
          pEVar54 = pEVar53;
          if (!bVar57) goto LAB_00108cd3;
          ZVar21 = ((ZydisDecodedInstruction *)pEVar36)->opcode_map;
          if (ZYDIS_OPCODE_MAP_MAX_VALUE < ZVar21) {
LAB_0010b27f:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xed0,
                          "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                         );
          }
          if ((0xe0cU >> (ZVar21 & 0x1f) & 1) != 0) goto LAB_00108cc4;
          if (ZVar21 != ZYDIS_OPCODE_MAP_DEFAULT) {
            if (ZVar21 != ZYDIS_OPCODE_MAP_0F) goto LAB_0010b27f;
            ZVar16 = ((ZydisDecodedInstruction *)pEVar36)->opcode;
            if (ZVar16 == ':') {
              ZVar21 = ZYDIS_OPCODE_MAP_0F3A;
            }
            else if (ZVar16 == '8') {
              ZVar21 = ZYDIS_OPCODE_MAP_0F38;
            }
            else {
              if (ZVar16 != '\x0f') goto LAB_00108cc4;
              pEVar54 = (Elf64_Ehdr *)0x80200004;
              if ((local_c0->prefixes).has_lock != '\0') goto LAB_00108cd3;
              ((ZydisDecodedInstruction *)pEVar36)->encoding = ZYDIS_INSTRUCTION_ENCODING_3DNOW;
              ZVar21 = ZYDIS_OPCODE_MAP_0F0F;
            }
LAB_00109c36:
            ((ZydisDecodedInstruction *)pEVar36)->opcode_map = ZVar21;
            goto LAB_00108cc4;
          }
          bVar40 = ((ZydisDecodedInstruction *)pEVar36)->opcode;
          if (bVar40 < 0xc4) {
            if (bVar40 == 0xf) {
              ZVar21 = ZYDIS_OPCODE_MAP_0F;
              goto LAB_00109c36;
            }
            if (bVar40 == 0x62) goto LAB_00109b9f;
            if (bVar40 != 0x8f) goto LAB_00108cc4;
            bVar40 = ((ZydisDecodedInstruction *)pEVar36)->length;
            bVar57 = true;
            if (bVar40 < 0xf) {
              if (local_c0->buffer_len == 0) {
                pEVar36 = (Elf64_Ehdr *)0x80200000;
                goto LAB_0010a26a;
              }
              bVar57 = (*local_c0->buffer & 0x18) == 0;
              pEVar36 = &Elf64_Ehdr_00100000;
              bVar58 = true;
            }
            else {
              pEVar36 = (Elf64_Ehdr *)0x80200002;
LAB_0010a26a:
              bVar58 = false;
            }
            if (bVar58) {
              pEVar36 = pEVar53;
            }
            bVar58 = (bool)(bVar58 ^ 1);
            pEVar54 = pEVar36;
            if ((!bVar58) && (!bVar57)) {
              bVar58 = true;
              pEVar54 = (Elf64_Ehdr *)0x80200006;
              if (((local_c8->attributes & 4) == 0) &&
                 ((pEVar54 = (Elf64_Ehdr *)0x80200004, (local_c0->prefixes).has_lock == '\0' &&
                  (pEVar54 = (Elf64_Ehdr *)0x80200005,
                  (local_c0->prefixes).mandatory_candidate == '\0')))) {
                (local_c8->raw).xop.offset = bVar40 - 1;
                local_b0._2_1_ = 0;
                local_b0._0_1_ = 0x8f;
                local_b0._1_1_ = '\0';
                if (bVar40 < 0xe) {
                  uVar32 = local_c0->buffer_len;
                  if (uVar32 < 2) {
                    pEVar54 = (Elf64_Ehdr *)0x80200000;
                    goto LAB_0010a929;
                  }
                  local_c8->length = bVar40 + 2;
                  uVar2 = *(undefined2 *)local_c0->buffer;
                  local_b0._1_1_ = (ZyanU8)uVar2;
                  local_b0._2_1_ = (byte)((ushort)uVar2 >> 8);
                  local_c0->buffer = local_c0->buffer + 2;
                  local_c0->buffer_len = uVar32 - 2;
                  pEVar54 = &Elf64_Ehdr_00100000;
                  bVar57 = true;
                }
                else {
                  pEVar54 = (Elf64_Ehdr *)0x80200002;
LAB_0010a929:
                  bVar57 = false;
                }
                bVar58 = true;
                if (bVar57) {
                  local_c8->encoding = ZYDIS_INSTRUCTION_ENCODING_XOP;
                  ZVar19 = ZydisDecodeXOP(local_c0->context,local_c8,(ZyanU8 *)&local_b0);
                  if ((int)ZVar19 < 0) {
                    pEVar54 = (Elf64_Ehdr *)(ulong)ZVar19;
                    bVar58 = true;
                    goto LAB_0010a2e1;
                  }
                  ZVar21 = (local_c8->raw).xop.m_mmmm + ZYDIS_OPCODE_MAP_0F;
                  pEVar53 = pEVar36;
LAB_0010aa61:
                  local_c8->opcode_map = ZVar21;
                  bVar58 = false;
                  pEVar54 = pEVar53;
                }
              }
            }
          }
          else {
            if (1 < bVar40 - 0xc4) goto LAB_00108cc4;
LAB_00109b9f:
            bVar46 = ((ZydisDecodedInstruction *)pEVar36)->length;
            if (bVar46 < 0xf) {
              if (local_c0->buffer_len == 0) {
                pEVar54 = (Elf64_Ehdr *)0x80200000;
                goto LAB_00109c66;
              }
              bVar56 = 0xbf < *local_c0->buffer;
              pEVar54 = &Elf64_Ehdr_00100000;
              bVar57 = true;
            }
            else {
              pEVar54 = (Elf64_Ehdr *)0x80200002;
LAB_00109c66:
              bVar56 = false;
              bVar57 = false;
            }
            bVar58 = true;
            if (bVar57) {
              if ((bVar56) || (local_c8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                uVar32 = local_c8->attributes;
                pEVar54 = (Elf64_Ehdr *)0x80200006;
                if (((uVar32 & 4) == 0) &&
                   ((pEVar54 = (Elf64_Ehdr *)0x80200004, (local_c0->prefixes).has_lock == '\0' &&
                    (pEVar54 = (Elf64_Ehdr *)0x80200005,
                    (local_c0->prefixes).mandatory_candidate == '\0')))) {
                  local_b0._1_1_ = '\0';
                  local_b0._2_1_ = 0;
                  local_b0._3_1_ = '\0';
                  local_b0._0_1_ = bVar40;
                  if (bVar40 == 0x62) {
                    if ((uVar32 & 0x20) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 5))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0xe4c,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if ((uVar32 & 0x40) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 6))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0xe4d,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if (0xc < bVar46) goto LAB_0010a90c;
                    uVar32 = local_c0->buffer_len;
                    if (uVar32 < 3) goto LAB_0010a940;
                    local_c8->length = bVar46 + 3;
                    pZVar33 = local_c0->buffer;
                    local_b0._3_1_ = pZVar33[2];
                    local_b0._1_1_ = (ZyanU8)*(undefined2 *)pZVar33;
                    local_b0._2_1_ = (byte)((ushort)*(undefined2 *)pZVar33 >> 8);
                    local_c0->buffer = pZVar33 + 3;
                    ZVar38 = uVar32 - 3;
LAB_0010aa01:
                    local_c0->buffer_len = ZVar38;
LAB_0010aa05:
                    pEVar54 = &Elf64_Ehdr_00100000;
                    bVar57 = true;
                  }
                  else {
                    if (bVar40 == 0xc5) {
                      (local_c8->raw).vex.offset = bVar46 - 1;
                      if ((uVar32 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe46,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      if (bVar46 < 0xf) {
                        ZVar38 = local_c0->buffer_len;
                        if (ZVar38 != 0) {
                          pZVar33 = local_c0->buffer;
                          local_c0->buffer = pZVar33 + 1;
                          local_b0._1_1_ = *pZVar33;
                          local_c8->length = bVar46 + 1;
                          local_c0->buffer_len = ZVar38 - 1;
                          goto LAB_0010aa05;
                        }
                        goto LAB_0010a940;
                      }
LAB_0010a90c:
                      pEVar54 = (Elf64_Ehdr *)0x80200002;
                    }
                    else {
                      if (bVar40 != 0xc4) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe54,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      (local_c8->raw).vex.offset = bVar46 - 1;
                      if ((uVar32 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe40,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      if (0xd < bVar46) goto LAB_0010a90c;
                      uVar32 = local_c0->buffer_len;
                      if (1 < uVar32) {
                        local_c8->length = bVar46 + 2;
                        uVar2 = *(undefined2 *)local_c0->buffer;
                        local_b0._1_1_ = (ZyanU8)uVar2;
                        local_b0._2_1_ = (byte)((ushort)uVar2 >> 8);
                        local_c0->buffer = local_c0->buffer + 2;
                        ZVar38 = uVar32 - 2;
                        goto LAB_0010aa01;
                      }
LAB_0010a940:
                      pEVar54 = (Elf64_Ehdr *)0x80200000;
                    }
                    bVar57 = false;
                  }
                  bVar58 = true;
                  if (bVar57) {
                    if (bVar40 - 0xc4 < 2) {
                      local_c8->encoding = ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS;
                      uVar22 = ZydisDecodeVEX(local_c0->context,local_c8,(ZyanU8 *)&local_b0);
                      pZVar33 = local_50;
joined_r0x0010aad1:
                      if ((int)uVar22 < 0) {
                        bVar58 = true;
                        pEVar54 = (Elf64_Ehdr *)(ulong)uVar22;
                        goto LAB_0010a2e1;
                      }
                    }
                    else {
                      if (bVar40 != 0x62) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe8c,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      ZVar16 = local_c8->length + 0xfc;
                      if ((local_b0._2_1_ & 4) != 0) {
                        (local_c8->raw).evex.offset = ZVar16;
                        local_c8->encoding = ZYDIS_INSTRUCTION_ENCODING_EVEX;
                        uVar22 = ZydisDecodeEVEX(local_c0->context,local_c8,(ZyanU8 *)&local_b0);
                        pZVar33 = local_58;
                        goto joined_r0x0010aad1;
                      }
                      (local_c8->raw).mvex.offset = ZVar16;
                      bVar58 = true;
                      if (local_c0->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                        pEVar54 = (Elf64_Ehdr *)0x80200001;
                        goto LAB_0010a2e1;
                      }
                      local_c8->encoding = ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE;
                      ZVar19 = ZydisDecodeMVEX(local_c0->context,local_c8,(ZyanU8 *)&local_b0);
                      pZVar33 = local_60;
                      if ((int)ZVar19 < 0) {
                        pEVar54 = (Elf64_Ehdr *)(ulong)ZVar19;
                        goto LAB_0010a2e1;
                      }
                    }
                    ZVar21 = (ZydisOpcodeMap)*pZVar33;
                    goto LAB_0010aa61;
                  }
                }
              }
              else {
                bVar58 = false;
                pEVar54 = pEVar53;
              }
            }
          }
LAB_0010a2e1:
          pEVar36 = (Elf64_Ehdr *)local_c8;
          if (bVar58) goto LAB_00108cd3;
        }
        else {
          bVar40 = ((ZydisDecodedInstruction *)pEVar36)->length;
          if (bVar40 < 0xf) {
            if (local_c0->buffer_len == 0) {
              pEVar54 = (Elf64_Ehdr *)0x80200000;
              goto LAB_00108cbe;
            }
            pZVar33 = local_c0->buffer;
            local_c0->buffer = pZVar33 + 1;
            ((ZydisDecodedInstruction *)pEVar36)->opcode = *pZVar33;
            ((ZydisDecodedInstruction *)pEVar36)->length = bVar40 + 1;
            local_c0->buffer_len = local_c0->buffer_len - 1;
            pEVar54 = &Elf64_Ehdr_00100000;
            bVar57 = true;
          }
          else {
            pEVar54 = (Elf64_Ehdr *)0x80200002;
LAB_00108cbe:
            bVar57 = false;
          }
          if (!bVar57) goto LAB_00108cd3;
        }
LAB_00108cc4:
        local_cc = (ZyanU16)((ZydisDecodedInstruction *)pEVar36)->opcode;
      }
      break;
    case '\x05':
      ZVar3 = ((ZydisDecodedInstruction *)pEVar36)->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xef5,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
      if ((0x34U >> (ZVar3 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar3 & 0x1f) & 1) == 0) goto LAB_00108820;
        local_cc = 1;
      }
      else {
LAB_001085fc:
        local_cc = 0;
      }
      break;
    case '\x06':
      bVar57 = ((ZydisDecodedInstruction *)pEVar36)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
      goto LAB_001086e5;
    case '\a':
      uVar22 = ZydisNodeHandlerModrmMod(local_c0,(ZydisDecodedInstruction *)pEVar36,&local_cc);
LAB_001086ed:
      pEVar54 = (Elf64_Ehdr *)(ulong)uVar22;
      goto LAB_00108cd3;
    case '\b':
      uVar22 = ZydisNodeHandlerModrmMod(local_c0,(ZydisDecodedInstruction *)pEVar36,&local_cc);
      if ((int)uVar22 < 0) goto LAB_001086ed;
      bVar57 = local_cc == 3;
LAB_001086e5:
      local_cc = (ZyanU16)!bVar57;
      break;
    case '\t':
      if ((((ZydisDecodedInstruction *)pEVar36)->raw).modrm.offset == '\0') {
        bVar40 = ((ZydisDecodedInstruction *)pEVar36)->length;
        (((ZydisDecodedInstruction *)pEVar36)->raw).modrm.offset = bVar40;
        bVar57 = true;
        if (bVar40 < 0xf) {
          ZVar38 = local_c0->buffer_len;
          if (ZVar38 == 0) {
            pEVar54 = (Elf64_Ehdr *)0x80200000;
          }
          else {
            pZVar33 = local_c0->buffer;
            local_c0->buffer = pZVar33 + 1;
            ZVar16 = *pZVar33;
            ((ZydisDecodedInstruction *)pEVar36)->length = bVar40 + 1;
            local_c0->buffer_len = ZVar38 - 1;
            pEVar54 = &Elf64_Ehdr_00100000;
            bVar57 = false;
          }
        }
        else {
          pEVar54 = (Elf64_Ehdr *)0x80200002;
        }
        if (bVar57) goto LAB_00108cd3;
        ZydisDecodeModRM((ZydisDecodedInstruction *)pEVar36,ZVar16);
      }
      local_cc = (ZyanU16)(((ZydisDecodedInstruction *)pEVar36)->raw).modrm.reg;
      break;
    case '\n':
      if ((((ZydisDecodedInstruction *)pEVar36)->raw).modrm.offset == '\0') {
        bVar40 = ((ZydisDecodedInstruction *)pEVar36)->length;
        (((ZydisDecodedInstruction *)pEVar36)->raw).modrm.offset = bVar40;
        bVar57 = true;
        if (bVar40 < 0xf) {
          ZVar38 = local_c0->buffer_len;
          if (ZVar38 == 0) {
            pEVar54 = (Elf64_Ehdr *)0x80200000;
          }
          else {
            pZVar33 = local_c0->buffer;
            local_c0->buffer = pZVar33 + 1;
            ZVar16 = *pZVar33;
            ((ZydisDecodedInstruction *)pEVar36)->length = bVar40 + 1;
            local_c0->buffer_len = ZVar38 - 1;
            pEVar54 = &Elf64_Ehdr_00100000;
            bVar57 = false;
          }
        }
        else {
          pEVar54 = (Elf64_Ehdr *)0x80200002;
        }
        if (bVar57) goto LAB_00108cd3;
        ZydisDecodeModRM((ZydisDecodedInstruction *)pEVar36,ZVar16);
      }
      local_cc = (ZyanU16)(((ZydisDecodedInstruction *)pEVar36)->raw).modrm.rm;
      break;
    case '\v':
      bVar57 = (local_c0->prefixes).group1 != '\0';
      goto LAB_001087b9;
    case '\f':
      ZVar16 = (local_c0->prefixes).mandatory_candidate;
      if (ZVar16 == 0xf3) {
        (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[(local_c0->prefixes).offset_mandatory].
        type = ZYDIS_PREFIX_TYPE_MANDATORY;
        local_cc = 3;
      }
      else if (ZVar16 == 0xf2) {
        (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[(local_c0->prefixes).offset_mandatory].
        type = ZYDIS_PREFIX_TYPE_MANDATORY;
        local_cc = 4;
      }
      else if (ZVar16 == 'f') {
        (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[(local_c0->prefixes).offset_mandatory].
        type = ZYDIS_PREFIX_TYPE_MANDATORY;
        pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 5);
        *pbVar6 = *pbVar6 & 0xf7;
        local_cc = 2;
      }
      else {
        local_cc = 1;
      }
      pZVar24 = ZydisDecoderTreeGetChildNode(node,0);
      break;
    case '\r':
      ZVar3 = ((ZydisDecodedInstruction *)pEVar36)->machine_mode;
      if ((ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) && ((local_c0->context->vector_unified).W != '\0'))
      {
LAB_00108820:
        local_cc = 2;
      }
      else {
        uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
        if ((uVar32 >> 0x2b & 1) != 0) {
          (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes
          [(local_c0->prefixes).offset_osz_override].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xf83,
                        "ZyanStatus ZydisNodeHandlerOperandSize(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xbU >> (ZVar3 & 0x1f) & 1) == 0) {
          uVar17 = (ushort)(uint)(uVar32 >> 0x2b);
          goto LAB_00108800;
        }
        local_cc = (ZyanU16)((uVar32 & 0x80000000000) == 0);
      }
      break;
    case '\x0e':
      ZVar3 = ((ZydisDecodedInstruction *)pEVar36)->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfa3,
                      "ZyanStatus ZydisNodeHandlerAddressSize(ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((0x34U >> (ZVar3 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar3 & 0x1f) & 1) == 0) {
          local_cc = 2 - ((((ZydisDecodedInstruction *)pEVar36)->attributes >> 0x2c & 1) != 0);
        }
        else {
          local_cc = (ZyanU16)((((ZydisDecodedInstruction *)pEVar36)->attributes >> 0x2c & 1) == 0);
        }
      }
      else {
        uVar17 = (ushort)(uint)(((ZydisDecodedInstruction *)pEVar36)->attributes >> 0x2c);
LAB_00108800:
        local_cc = uVar17 & 1;
      }
      break;
    case '\x0f':
      if (local_c0->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfac,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(((ZydisDecodedInstruction *)pEVar36)->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb3,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb6,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb9,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfbc,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfbf,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      local_cc = (ZyanU16)(local_c0->context->vector_unified).LL;
      pEVar54 = &Elf64_Ehdr_00100000;
      if (local_cc == 3) {
        pEVar54 = (Elf64_Ehdr *)0x80200001;
      }
      goto LAB_00108cd3;
    case '\x10':
      if (local_c0->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfcd,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(((ZydisDecodedInstruction *)pEVar36)->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfe3,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfd7,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfda,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfdd,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfe0,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      local_cc = (ZyanU16)(local_c0->context->vector_unified).W;
      break;
    case '\x11':
      if (local_c0->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfec,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(((ZydisDecodedInstruction *)pEVar36)->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x1002,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xff6,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xff9,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xffc,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfff,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      local_cc = (ZyanU16)(local_c0->context->vector_unified).B;
      break;
    case '\x12':
      if (((ZydisDecodedInstruction *)pEVar36)->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x100e,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x100f,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      local_cc = (ZyanU16)(((ZydisDecodedInstruction *)pEVar36)->raw).evex.b;
      break;
    case '\x13':
      if (((ZydisDecodedInstruction *)pEVar36)->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x101b,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x101c,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      local_cc = (ZyanU16)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.E;
      break;
    case '\x14':
      bVar57 = local_c0->decoder->decoder_mode[1] == '\0';
      goto LAB_001087b1;
    case '\x15':
      bVar57 = local_c0->decoder->decoder_mode[2] == '\0';
      goto LAB_001087b1;
    case '\x16':
      bVar57 = local_c0->decoder->decoder_mode[3] == '\0';
      goto LAB_001087b1;
    case '\x17':
      bVar57 = local_c0->decoder->decoder_mode[4] == '\0';
      goto LAB_001087b1;
    case '\x18':
      bVar57 = local_c0->decoder->decoder_mode[5] == '\0';
      goto LAB_001087b1;
    case '\x19':
      bVar57 = local_c0->decoder->decoder_mode[6] == '\0';
      goto LAB_001087b1;
    case '\x1a':
      bVar57 = local_c0->decoder->decoder_mode[7] == '\0';
      goto LAB_001087b1;
    case '\x1b':
      bVar57 = local_c0->decoder->decoder_mode[8] == '\0';
LAB_001087b1:
      bVar57 = !bVar57;
LAB_001087b9:
      local_cc = (ZyanU16)bVar57;
      pEVar54 = (Elf64_Ehdr *)0x0;
      goto LAB_00108cd3;
    default:
      if (-1 < (char)ZVar55) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x1311,
                      "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      ZydisGetInstructionDefinition
                (((ZydisDecodedInstruction *)pEVar36)->encoding,node->value,
                 (ZydisInstructionDefinition **)&local_b0);
      pZVar5 = local_c0->context;
      if (pZVar5 == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xd15,
                      "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar10 = (ulong *)CONCAT44(local_b0._4_4_,
                                  CONCAT13(local_b0._3_1_,
                                           CONCAT12(local_b0._2_1_,
                                                    CONCAT11(local_b0._1_1_,(byte)local_b0))));
      if (puVar10 == (ulong *)0x0) {
        __assert_fail("definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xd17,
                      "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
      bVar40 = (byte)(uVar32 >> 0x2b) & 1;
      ZVar3 = ((ZydisDecodedInstruction *)pEVar36)->machine_mode;
      if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
        bVar40 = bVar40 | (pZVar5->vector_unified).W * '\x02' & 2 | 4;
      }
      else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) ||
              (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32)) {
        bVar40 = bVar40 | 2;
      }
      puVar45 = ZydisSetEffectiveOperandWidth_operand_size_map;
      bVar40 = ZydisSetEffectiveOperandWidth_operand_size_map
               [(ulong)bVar40 + (ulong)((uint)(*puVar10 >> 0x21) & 7) * 8];
      ((ZydisDecodedInstruction *)pEVar36)->operand_width = bVar40;
      pZVar5->eosz_index = bVar40 >> 5;
      if ((*puVar10 & 0xe00000000) == 0x200000000) {
        ((ZydisDecodedInstruction *)pEVar36)->operand_width = '\b';
      }
      bVar40 = (byte)(uVar32 >> 0x2c) & 1;
      if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
        bVar40 = bVar40 | 4;
      }
      else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) ||
              (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32)) {
        bVar40 = bVar40 | 2;
      }
      uVar32 = (ulong)((uint)(*puVar10 >> 0x24) & 3);
      if (uVar32 == 3) {
        __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdc7,
                      "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      bVar40 = ZydisSetEffectiveAddressWidth_address_size_map[(ulong)bVar40 + uVar32 * 8];
      ((ZydisDecodedInstruction *)pEVar36)->address_width = bVar40;
      pZVar5->easz_index = bVar40 >> 5;
      ZydisGetInstructionEncodingInfo(node,(ZydisInstructionEncodingInfo **)&local_38);
      pEVar54 = local_38;
      if (local_38 == (Elf64_Ehdr *)0x0) {
        __assert_fail("info",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xc90,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
      local_98 = local_c0->context;
      if ((local_38->e_ident_magic_num & 1) == 0) {
LAB_00108f9d:
        if (((pEVar54->e_ident_magic_num & 2) == 0) ||
           (ZVar19 = ZydisReadDisplacement
                               (local_c0,local_c8,pEVar54->e_ident_magic_str[local_98->easz_index]),
           -1 < (int)ZVar19)) {
          if ((pEVar54->e_ident_magic_num & 4) != 0) {
            bVar40 = pEVar54->e_ident_abiversion;
            if (bVar40 != 0) {
              *(byte *)&local_c8->attributes = (byte)local_c8->attributes | 0x80;
            }
            ZVar19 = ZydisReadImmediate(local_c0,local_c8,'\0',
                                        (&pEVar54->e_ident_class)[local_98->eosz_index],
                                        pEVar54->e_ident_osabi,bVar40);
            if ((int)ZVar19 < 0) goto LAB_00109078;
          }
          if ((pEVar54->e_ident_magic_num & 8) != 0) {
            if ((pEVar54->e_ident_magic_num & 2) != 0) {
              __assert_fail("!(info->flags & 0x02)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xd00,
                            "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                           );
            }
            ZVar19 = ZydisReadImmediate(local_c0,local_c8,'\x01',
                                        pEVar54->e_ident_pad[local_98->eosz_index],
                                        pEVar54->e_ident_pad[3],pEVar54->e_ident_pad[4]);
            if ((int)ZVar19 < 0) goto LAB_00109078;
          }
          ZVar19 = 0x100000;
        }
      }
      else {
        if ((local_c8->raw).modrm.offset != '\0') {
LAB_00108d1d:
          if ((pEVar54->e_ident_magic_num & 0x10) == 0) {
            ZVar16 = local_c8->address_width;
            if ((ZVar16 == '@') || (ZVar16 == ' ')) {
              ZVar16 = (local_c8->raw).modrm.mod;
              if (ZVar16 == '\x03') {
                bVar57 = false;
              }
              else {
                bVar57 = (local_c8->raw).modrm.rm == '\x04';
              }
              switch(ZVar16) {
              case '\0':
                if ((local_c8->raw).modrm.rm != '\x05') goto switchD_00108db9_caseD_3;
                ZVar16 = ' ';
                if (local_c8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                  *(byte *)&local_c8->attributes = (byte)local_c8->attributes | 0x80;
                }
                break;
              case '\x01':
                ZVar16 = '\b';
                break;
              case '\x02':
                ZVar16 = ' ';
                break;
              case '\x03':
switchD_00108db9_caseD_3:
                ZVar16 = '\0';
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0xcd2,
                              "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                             );
              }
            }
            else {
              if (ZVar16 != '\x10') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0xcd6,
                              "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                             );
              }
              switch((local_c8->raw).modrm.mod) {
              case '\0':
                ZVar16 = ((local_c8->raw).modrm.rm == '\x06') << 4;
                break;
              case '\x01':
                ZVar16 = '\b';
                break;
              case '\x02':
                ZVar16 = '\x10';
                break;
              case '\x03':
                ZVar16 = '\0';
                break;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0xcb6,
                              "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                             );
              }
              bVar57 = false;
            }
            ZVar19 = (ZyanStatus)pEVar36;
            if (bVar57) {
              bVar40 = local_c8->length;
              (local_c8->raw).sib.offset = bVar40;
              if (bVar40 < 0xf) {
                ZVar38 = local_c0->buffer_len;
                if (ZVar38 == 0) {
                  ZVar18 = 0x80200000;
                  bVar57 = false;
                }
                else {
                  pbVar6 = local_c0->buffer;
                  local_c0->buffer = pbVar6 + 1;
                  puVar45 = (undefined1 *)(ulong)*pbVar6;
                  local_c8->length = bVar40 + 1;
                  local_c0->buffer_len = ZVar38 - 1;
                  ZVar18 = 0x100000;
                  bVar57 = true;
                }
              }
              else {
                bVar57 = false;
                ZVar18 = 0x80200002;
              }
              if (bVar57) {
                uVar32 = local_c8->attributes;
                if ((uVar32 & 1) == 0) {
                  __assert_fail("instruction->attributes & (1ULL << 0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                if ((local_c8->raw).modrm.rm != '\x04') {
                  __assert_fail("instruction->raw.modrm.rm == 4",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x2c1,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                if ((uVar32 & 2) != 0) {
                  __assert_fail("!(instruction->attributes & (1ULL << 1))",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                if (local_c8->length - 1 != (uint)bVar40) {
                  __assert_fail("instruction->raw.sib.offset == instruction->length - 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x2c3,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
                }
                local_c8->attributes = uVar32 | 2;
                (local_c8->raw).sib.scale = (byte)(((ulong)puVar45 & 0xffffffff) >> 6) & 3;
                (local_c8->raw).sib.index = (byte)(((ulong)puVar45 & 0xffffffff) >> 3) & 7;
                bVar40 = (byte)puVar45 & 7;
                (local_c8->raw).sib.base = bVar40;
                ZVar18 = ZVar19;
                if ((bVar40 == 5) && (ZVar16 = ' ', (local_c8->raw).modrm.mod == '\x01')) {
                  ZVar16 = '\b';
                }
              }
              ZVar19 = ZVar18;
              if (bVar57) goto LAB_00108f3f;
              bVar57 = false;
            }
            else {
LAB_00108f3f:
              if (ZVar16 == '\0') {
                bVar57 = true;
              }
              else {
                ZVar18 = ZydisReadDisplacement(local_c0,local_c8,ZVar16);
                bVar57 = -1 < (int)ZVar18;
                if (!bVar57) {
                  ZVar19 = ZVar18;
                }
              }
            }
            if (!bVar57) goto LAB_00109078;
          }
          bVar40 = 1;
          if ((local_c8->raw).modrm.mod != '\x03') {
            bVar40 = pEVar54->e_ident_magic_num >> 4 & 1;
          }
          (local_98->reg_info).is_mod_reg = bVar40;
          goto LAB_00108f9d;
        }
        bVar40 = local_c8->length;
        (local_c8->raw).modrm.offset = bVar40;
        if (bVar40 < 0xf) {
          ZVar38 = local_c0->buffer_len;
          if (ZVar38 == 0) {
            pEVar36 = (Elf64_Ehdr *)0x80200000;
            goto LAB_00108cfc;
          }
          pbVar6 = local_c0->buffer;
          local_c0->buffer = pbVar6 + 1;
          pZVar23 = (ZydisDecodedInstruction *)(ulong)*pbVar6;
          local_c8->length = bVar40 + 1;
          local_c0->buffer_len = ZVar38 - 1;
          pEVar36 = &Elf64_Ehdr_00100000;
          bVar57 = true;
        }
        else {
          pEVar36 = (Elf64_Ehdr *)0x80200002;
LAB_00108cfc:
          bVar57 = false;
          pZVar23 = local_c8;
        }
        ZVar19 = (ZyanStatus)pEVar36;
        if (bVar57) {
          ZydisDecodeModRM(local_c8,(ZyanU8)pZVar23);
          goto LAB_00108d1d;
        }
      }
LAB_00109078:
      pEVar36 = (Elf64_Ehdr *)local_c8;
      if ((int)ZVar19 < 0) {
        pEVar54 = (Elf64_Ehdr *)(ulong)ZVar19;
        goto LAB_0010a844;
      }
      puVar10 = (ulong *)CONCAT44(local_b0._4_4_,
                                  CONCAT13(local_b0._3_1_,
                                           CONCAT12(local_b0._2_1_,
                                                    CONCAT11(local_b0._1_1_,(byte)local_b0))));
      if (puVar10 == (ulong *)0x0) {
        __assert_fail("definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x10fe,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      ZVar4 = local_c8->encoding;
      uVar32 = (ulong)ZVar4;
      if (5 < uVar32) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x1199,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar22 = (uint)puVar10[1];
      pZVar5 = local_98;
      switch(uVar32) {
      case 0:
        if ((((*puVar10 >> 0x2d & 1) == 0) ||
            (local_c8->machine_mode != ZYDIS_MACHINE_MODE_MAX_VALUE)) &&
           (((*puVar10 >> 0x2e & 1) == 0 ||
            (1 < local_c8->machine_mode - ZYDIS_MACHINE_MODE_LONG_COMPAT_32)))) {
          bVar57 = (int)uVar22 < 0 || (local_c0->prefixes).has_lock == '\0';
          pEVar54 = (Elf64_Ehdr *)0x80200004;
        }
        else {
          pEVar54 = (Elf64_Ehdr *)0x80200001;
          bVar57 = false;
        }
        local_c9 = true;
        local_a4 = 0;
        local_88 = 0;
        local_80 = 0;
        bVar40 = 0;
        if (bVar57) break;
        goto LAB_00109734;
      case 1:
        local_c9 = true;
        local_a4 = 0;
        local_88 = 0;
        local_80 = 0;
        bVar40 = 0;
        break;
      case 2:
        local_c9 = true;
        bVar40 = (byte)((uint5)puVar10[1] >> 0x1e) & 0x1f;
        local_a4 = 0;
        local_88 = 0;
        local_80 = 0;
        break;
      case 3:
        bVar40 = (byte)((uint6)puVar10[1] >> 0x1e) & 0x1f;
        local_80 = (ulong)CONCAT11((char)((ushort)*(undefined2 *)((long)puVar10 + 0xc) >> 8),
                                   (byte)*(undefined2 *)((long)puVar10 + 0xc) >> 3) &
                   0xffffffffffffff01;
        local_c9 = ((uint6)puVar10[1] & 0x2000000000) == 0;
        local_a4 = 0;
        local_88 = 0;
        break;
      case 4:
        local_c9 = true;
        bVar40 = (byte)((uint5)puVar10[1] >> 0x1e) & 0x1f;
        local_80 = (ulong)(*(byte *)((long)puVar10 + 0xc) >> 3) & 0xffffffffffffff01;
        local_88 = (ulong)(*(byte *)((long)puVar10 + 0xc) >> 4 & 1);
        local_a4 = *(ushort *)((long)puVar10 + 0xe) >> 2 & 3;
        pEVar54 = (Elf64_Ehdr *)0x8020000a;
        if (((local_c8->raw).evex.z != '\0') && ((*(ushort *)((long)puVar10 + 0xe) & 0x10) == 0))
        goto LAB_00109734;
        break;
      case 5:
        uVar17 = *(ushort *)((long)puVar10 + 0xc);
        uVar43 = (ulong)(uVar17 >> 6 & 0x1f);
        if (0x19 < uVar43) {
          __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x118d,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar31 = (ulong)(local_c8->raw).mvex.SSS;
        if (7 < uVar31) {
          __assert_fail("instruction->raw.mvex.SSS < 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x118e,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        pEVar54 = (Elf64_Ehdr *)0x80200001;
        if (ZydisCheckErrorConditions_lookup[uVar31 + uVar43 * 8] == '\0') goto LAB_00109734;
        local_c9 = true;
        bVar40 = (byte)(CONCAT24(uVar17,(int)puVar10[1]) >> 0x1e) & 0x1f;
        local_80 = (ulong)CONCAT11((char)(uVar17 >> 8),(byte)uVar17 >> 3) & 0xffffffffffffff01;
        local_a4 = uVar17 >> 0xb & 3;
        local_88 = 0;
      }
      uVar52 = (uint)pEVar54;
      bVar46 = (byte)(uVar22 >> 0xd);
      local_9d = bVar46 & 0x1f;
      uVar34 = uVar22 >> 0x12;
      pZVar7 = local_c0->context;
      ZVar15 = (pZVar7->reg_info).is_mod_reg;
      uVar35 = 0;
      uVar26 = (uint)(bVar46 & 0xf);
      if ((uVar22 >> 0xd & 0x1f) == 0) {
        uVar26 = 0;
      }
      local_98 = (ZydisDecoderContext *)CONCAT44(local_98._4_4_,uVar26);
      pZVar5 = local_98;
      local_9e = true;
      if ((uVar34 & 0x1f) == 0) {
        bVar57 = true;
      }
      else if (ZVar15 == '\0') {
        uVar35 = uVar34 & 0xffffff07;
        bVar57 = (uVar34 & 8) == 0;
      }
      else {
        uVar35 = uVar34 & 0xffffff0f;
        local_9e = ((byte)uVar34 & 0x1f) < 0x10;
        bVar57 = true;
      }
      if (bVar57) {
LAB_001092ac:
        if (pZVar7 == (ZydisDecoderContext *)0x0) {
          __assert_fail("context",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x103b,
                        "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                       );
        }
        if (ZVar15 == '\0') {
          bVar57 = (local_c8->raw).modrm.rm == '\x04';
        }
        else {
          bVar57 = false;
        }
        bVar47 = (byte)uVar35;
        bVar51 = bVar47 == 4 & bVar57;
        bVar46 = (pZVar7->vector_unified).vvvv;
        bVar48 = bVar46 & 7;
        bVar44 = (local_c8->raw).modrm.reg;
        local_b1 = (local_c8->raw).modrm.rm;
        local_b2 = *(byte *)((long)(local_c8->raw).imm + (ulong)bVar57 * 4 + -0x16);
        bVar14 = (local_c8->raw).sib.index;
        local_98._0_1_ = (char)uVar26;
        local_68 = (ulong)uVar26;
        bVar49 = bVar14;
        bVar50 = local_b1;
        if (local_c8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
          bVar50 = 0;
          bVar49 = 0;
          if (bVar51 != 0) {
            bVar49 = (pZVar7->vector_unified).V2 << 4;
          }
          if (0xfffffffd < ZVar4 + ~ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
            bVar50 = (pZVar7->vector_unified).X << 4;
          }
          if (ZVar15 == '\0') {
            local_6c = 0xff;
          }
          else {
            local_6c = (uint)(byte)ZydisPopulateRegisterIds_mask_rm[bVar47];
          }
          bVar13 = (pZVar7->vector_unified).B << 3;
          bVar48 = (pZVar7->vector_unified).V2 << 4 | bVar46;
          local_b2 = local_b2 | bVar13;
          bVar44 = ((pZVar7->vector_unified).R << 3 | (pZVar7->vector_unified).R2 << 4 | bVar44) &
                   ZydisPopulateRegisterIds_mask_reg[local_68];
          bVar49 = bVar49 | bVar14 | (pZVar7->vector_unified).X << 3;
          local_9f = bVar14;
          bVar50 = (bVar50 | local_b1 | bVar13) & (byte)local_6c;
        }
        local_b3 = ZVar15;
        local_9c = uVar35;
        local_98 = pZVar5;
        local_8c = uVar52;
        local_78 = uVar32;
        if ((bVar40 == 0) &&
           (((pZVar7->vector_unified).vvvv != '\0' ||
            ((bVar51 == 0 && ((pZVar7->vector_unified).V2 != '\0')))))) {
LAB_001095e2:
          pEVar54 = (Elf64_Ehdr *)0x80200003;
          bVar57 = false;
        }
        else {
          bVar57 = local_c8->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
          pEVar54 = (Elf64_Ehdr *)0x80200003;
          if ((byte)ZydisPopulateRegisterIds_available_regs[local_68 + (ulong)bVar57 * 0xc] <=
              bVar44) goto LAB_001095e2;
          if ((bVar48 < (byte)ZydisPopulateRegisterIds_available_regs
                              [(ulong)bVar40 + (ulong)bVar57 * 0xc]) &&
             ((ZVar15 == '\0' ||
              (bVar50 < (byte)ZydisPopulateRegisterIds_available_regs
                              [(ulong)bVar47 + (ulong)bVar57 * 0xc])))) {
            bVar46 = bVar44;
            if ((char)local_98 != '\b') {
              bVar46 = 0xff;
            }
            bVar14 = bVar50;
            if (bVar47 != 8) {
              bVar14 = bVar46;
            }
            if (ZVar15 == '\0') {
              bVar14 = bVar46;
            }
            if (-1 < (char)bVar14) {
              if (0xf < bVar14) {
                __assert_fail("id_cr < (sizeof(lookup) / sizeof((lookup)[0]))",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0x10dc,
                              "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                             );
              }
              if ((0xfee2UL >> ((ulong)bVar14 & 0x3f) & 1) != 0) goto LAB_001095ef;
            }
            (pZVar7->reg_info).id_reg = -((char)local_98 == '\0') | bVar44;
            (pZVar7->reg_info).id_rm = -(ZVar15 == '\0') | -(bVar47 == 0) | bVar50;
            (pZVar7->reg_info).id_ndsndd = -(bVar40 == 0) | bVar48;
            (pZVar7->reg_info).id_base = local_b2;
            (pZVar7->reg_info).id_index = bVar49;
            pEVar54 = &Elf64_Ehdr_00100000;
            bVar57 = true;
          }
          else {
LAB_001095ef:
            bVar57 = false;
          }
        }
        pEVar53 = (Elf64_Ehdr *)(ulong)uVar52;
        if (((bVar57) &&
            ((local_9d < 0x10 ||
             (pEVar54 = (Elf64_Ehdr *)0x80200003, (pZVar7->reg_info).id_reg != '\x01')))) &&
           (((bool)local_9e != false ||
            (pEVar54 = (Elf64_Ehdr *)0x80200003, (pZVar7->reg_info).id_rm != '\x01')))) {
          if ((char)local_80 != '\0') {
            if ((local_c8->raw).modrm.mod == '\x03') {
              __assert_fail("instruction->raw.modrm.mod != 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x11d2,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (local_b1 != 4) {
              __assert_fail("instruction->raw.modrm.rm == 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x11d3,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            ZVar16 = (pZVar7->reg_info).id_index;
            ZVar25 = (pZVar7->reg_info).id_reg;
            ZVar28 = 0xf0;
            if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
              if ((((char)local_98 != '\x04') || (bVar47 != 4)) || (bVar40 != 4)) {
                __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0x11dd,
                              "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              ZVar28 = (pZVar7->reg_info).id_ndsndd;
            }
            if ((ZVar4 & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
              if (((bVar40 != 0) || ((uVar26 & 0xb) != 0)) || (bVar47 != 4)) {
                __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0x11e7,
                              "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              if ((char)local_98 == '\0') {
                ZVar25 = 0xf1;
              }
            }
            if ((ZVar28 == ZVar16 || ZVar25 == ZVar16) || ZVar28 == ZVar25) {
              pEVar54 = (Elf64_Ehdr *)0x80200003;
              goto LAB_00109734;
            }
          }
          if ((char)local_88 != '\0') {
            if (1 < ZVar4 - ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
              __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x11fd,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            ZVar16 = (pZVar7->reg_info).id_reg;
            if (ZVar16 == (pZVar7->reg_info).id_ndsndd) {
              pEVar53 = (Elf64_Ehdr *)0x80200003;
              bVar57 = false;
            }
            else {
              bVar58 = ZVar16 != (pZVar7->reg_info).id_rm;
              bVar57 = bVar58 || ZVar15 == '\0';
              if (!bVar58 && ZVar15 != '\0') {
                pEVar53 = (Elf64_Ehdr *)0x80200003;
              }
            }
            uVar52 = (uint)pEVar53;
            pEVar54 = pEVar53;
            if (!bVar57) goto LAB_00109734;
          }
          if (local_c9 == false) {
            if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
              __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x120d,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (ZVar15 == '\0') {
              __assert_fail("is_reg",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x120e,
                            "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            ZVar16 = (pZVar7->reg_info).id_reg;
            ZVar25 = (pZVar7->reg_info).id_ndsndd;
            if (ZVar16 == ZVar25) {
              pEVar54 = (Elf64_Ehdr *)0x80200003;
              bVar57 = false;
            }
            else {
              ZVar28 = (pZVar7->reg_info).id_rm;
              bVar57 = ZVar25 != ZVar28 && ZVar16 != ZVar28;
              if (ZVar25 == ZVar28 || ZVar16 == ZVar28) {
                uVar52 = 0x80200003;
              }
              pEVar54 = (Elf64_Ehdr *)(ulong)uVar52;
            }
            if (!bVar57) goto LAB_00109734;
          }
          if (local_a4 < 2) {
LAB_00109bbb:
            pEVar54 = &Elf64_Ehdr_00100000;
          }
          else if (local_a4 == 3) {
            pEVar54 = (Elf64_Ehdr *)0x8020000a;
            if ((pZVar7->vector_unified).mask == '\0') goto LAB_00109bbb;
          }
          else {
            if ((pZVar7->vector_unified).mask != '\0') goto LAB_00109bbb;
            pEVar54 = (Elf64_Ehdr *)0x8020000a;
          }
        }
      }
      else {
        bVar57 = true;
        if ((local_c0->decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
           ((local_c8->raw).modrm.mod == '\0')) {
          bVar57 = (local_c8->raw).modrm.rm != '\x05';
        }
        pEVar54 = (Elf64_Ehdr *)((ulong)pEVar54 & 0xffffffff);
        if (!bVar57) {
          pEVar54 = (Elf64_Ehdr *)0x80200003;
        }
        uVar52 = (uint)pEVar54;
        if (bVar57) goto LAB_001092ac;
      }
LAB_00109734:
      local_98 = pZVar5;
      if ((int)pEVar54 < 0) goto LAB_0010a844;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        bVar40 = local_c8->length;
        if (bVar40 < 0xf) {
          if (local_c0->buffer_len == 0) {
            uVar22 = 0x80200000;
            goto LAB_001097b0;
          }
          pZVar33 = local_c0->buffer;
          local_c0->buffer = pZVar33 + 1;
          local_c8->opcode = *pZVar33;
          local_c8->length = bVar40 + 1;
          local_c0->buffer_len = local_c0->buffer_len - 1;
          uVar22 = 0x100000;
          bVar57 = true;
        }
        else {
          uVar22 = 0x80200002;
LAB_001097b0:
          bVar57 = false;
        }
        if (bVar57) {
          pZVar24 = ZydisDecoderTreeGetChildNode(&zydis_decoder_tree_root,0xf);
          pZVar24 = ZydisDecoderTreeGetChildNode(pZVar24,0xf);
          node = ZydisDecoderTreeGetChildNode
                           (pZVar24,(ushort)((ZydisDecodedInstruction *)pEVar36)->opcode);
          pEVar54 = (Elf64_Ehdr *)0x80200001;
          if (node->type != '\0') {
            if (node->type != '\b') {
              __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x12db,
                            "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                           );
            }
            node = ZydisDecoderTreeGetChildNode
                             (node,(ushort)((((ZydisDecodedInstruction *)pEVar36)->raw).modrm.mod !=
                                           '\x03'));
            if (-1 < (char)node->type) {
              __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x12de,
                            "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                           );
            }
            ZydisGetInstructionDefinition
                      (((ZydisDecodedInstruction *)pEVar36)->encoding,node->value,
                       (ZydisInstructionDefinition **)&local_b0);
            goto LAB_00109841;
          }
        }
        else {
          pEVar54 = (Elf64_Ehdr *)(ulong)uVar22;
        }
        goto LAB_0010a844;
      }
LAB_00109841:
      pZVar11 = (ZydisMnemonic *)
                CONCAT44(local_b0._4_4_,
                         CONCAT13(local_b0._3_1_,
                                  CONCAT12(local_b0._2_1_,CONCAT11(local_b0._1_1_,(byte)local_b0))))
      ;
      ((ZydisDecodedInstruction *)pEVar36)->mnemonic =
           *pZVar11 & (ZYDIS_MNEMONIC_VPSHLDVD|ZYDIS_MNEMONIC_PAVGB);
      ((ZydisDecodedInstruction *)pEVar36)->operand_count = (byte)(*pZVar11 >> 0xb) & 0xf;
      ((ZydisDecodedInstruction *)pEVar36)->operand_count_visible = (byte)(*pZVar11 >> 0xf) & 7;
      pZVar5 = local_c0->context;
      pZVar5->definition = pZVar11;
      puVar12 = (undefined8 *)
                CONCAT44(local_b0._4_4_,
                         CONCAT13(local_b0._3_1_,
                                  CONCAT12(local_b0._2_1_,CONCAT11(local_b0._1_1_,(byte)local_b0))))
      ;
      ZVar29 = (ZydisInstructionCategory)((ulong)*puVar12 >> 0x2f) &
               (ZYDIS_CATEGORY_UNCOND_BR|ZYDIS_CATEGORY_DATAXFER);
      (((ZydisDecodedInstruction *)pEVar36)->meta).category = ZVar29;
      (((ZydisDecodedInstruction *)pEVar36)->meta).isa_set =
           (ZydisISASet)((ulong)*puVar12 >> 0x36) & (ZYDIS_ISA_SET_PAUSE|ZYDIS_ISA_SET_PADLOCK_RNG);
      (((ZydisDecodedInstruction *)pEVar36)->meta).isa_ext =
           (uint)((ulong)*puVar12 >> 0x3e) + *(int *)(puVar12 + 1) * 4 &
           (ZYDIS_ISA_EXT_SMAP|ZYDIS_ISA_EXT_SHA);
      ZVar37 = *(uint *)(puVar12 + 1) >> 5 & ZYDIS_BRANCH_TYPE_FAR;
      (((ZydisDecodedInstruction *)pEVar36)->meta).branch_type = ZVar37;
      if (((ZVar37 != ZYDIS_BRANCH_TYPE_NONE) &&
          ((0x37 < ZVar29 - ZYDIS_CATEGORY_CALL ||
           ((0x80000000000101U >> ((ulong)(ZVar29 - ZYDIS_CATEGORY_CALL) & 0x3f) & 1) == 0)))) &&
         (ZVar29 != ZYDIS_CATEGORY_UNCOND_BR)) {
        __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x12f2,
                      "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                     );
      }
      (((ZydisDecodedInstruction *)pEVar36)->meta).exception_class =
           *(uint *)(puVar12 + 1) >> 7 & (ZYDIS_EXCEPTION_CLASS_E10|ZYDIS_EXCEPTION_CLASS_E9NF);
      pZVar8 = local_c0->decoder;
      pEVar54 = &Elf64_Ehdr_00100000;
      if (pZVar8->decoder_mode[0] != '\0') goto LAB_0010a844;
      if ((*(uint *)(puVar12 + 1) >> 0x17 & 3) != 0) {
        ((ZydisDecodedInstruction *)pEVar36)->attributes =
             ((ZydisDecodedInstruction *)pEVar36)->attributes |
             *(ulong *)(ZydisSetAttributes_mapping +
                       (ulong)((byte)(*(uint *)(puVar12 + 1) >> 0x17) & 3) * 8);
      }
      if ((*(uint *)(puVar12 + 1) >> 0x19 & 3) != 0) {
        ((ZydisDecodedInstruction *)pEVar36)->attributes =
             ((ZydisDecodedInstruction *)pEVar36)->attributes |
             *(ulong *)(ZydisSetAttributes_mapping_91 +
                       (ulong)((byte)(*(uint *)(puVar12 + 1) >> 0x19) & 3) * 8);
      }
      if ((*(uint *)(puVar12 + 1) >> 0x1b & 3) != 0) {
        ((ZydisDecodedInstruction *)pEVar36)->attributes =
             ((ZydisDecodedInstruction *)pEVar36)->attributes |
             *(ulong *)(ZydisSetAttributes_mapping_93 +
                       (ulong)((byte)(*(uint *)(puVar12 + 1) >> 0x1b) & 3) * 8);
      }
      ZVar4 = ((ZydisDecodedInstruction *)pEVar36)->encoding;
      if (ZVar4 - ZYDIS_INSTRUCTION_ENCODING_3DNOW < 5) {
        if ((*(byte *)((long)puVar12 + 0xb) & 0x20) != 0) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x4000000;
          bVar40 = (local_c0->prefixes).effective_segment;
          if (bVar40 < 0x36) {
            if (bVar40 == 0) goto LAB_00109f12;
            if (bVar40 == 0x26) {
LAB_00109ed9:
              uVar43 = 0x10004000000;
            }
            else {
              uVar43 = 0x2004000000;
              if (bVar40 != 0x2e) goto LAB_0010b396;
            }
          }
          else if (bVar40 < 100) {
            if (bVar40 != 0x36) {
              if (bVar40 != 0x3e) {
LAB_0010b396:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0x8c8,
                              "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              goto LAB_001099a9;
            }
LAB_00109ecd:
            uVar43 = 0x4004000000;
          }
          else if (bVar40 == 100) {
LAB_00109f01:
            uVar43 = 0x20004000000;
          }
          else {
            if (bVar40 != 0x65) goto LAB_0010b396;
LAB_00109b81:
            uVar43 = 0x40004000000;
          }
LAB_00109f0b:
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | uVar43;
LAB_00109f12:
          if ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x7e000000000) != 0) {
            (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes
            [(local_c0->prefixes).offset_segment].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
        }
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x8d3,
                        "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((*(byte *)((long)puVar12 + 0xb) & 0x40) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 1);
          *pbVar6 = *pbVar6 | 1;
        }
        if (*(int *)(puVar12 + 1) < 0) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x10000;
          if ((local_c0->prefixes).has_lock != '\0') {
            ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x8010000;
            (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[(local_c0->prefixes).offset_lock].
            type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 1) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 2;
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 2) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 4;
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 4) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 8;
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 8) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 0x10;
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 0x10) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 0x20;
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 0x20) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 0x40;
        }
        if ((*(byte *)((long)puVar12 + 0xc) & 0x80) != 0) {
          pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 2);
          *pbVar6 = *pbVar6 | 0x80;
        }
        ZVar16 = (local_c0->prefixes).group1;
        if (ZVar16 == 0xf3) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          uVar22 = (uint)uVar32;
          if ((uVar22 >> 0x11 & 1) == 0) {
            if ((uVar22 >> 0x12 & 1) == 0) {
              if (((uVar22 >> 0x16 & 1) == 0) ||
                 (((uVar22 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar12 + 0xc) & 0x80) == 0))))
              goto LAB_00109da1;
              ZVar41 = uVar32 | 0x200000000;
            }
            else {
              ZVar41 = uVar32 | 0x20000000;
            }
          }
          else {
            ZVar41 = uVar32 | 0x10000000;
          }
LAB_00109d9d:
          ((ZydisDecodedInstruction *)pEVar36)->attributes = ZVar41;
        }
        else if (ZVar16 == 0xf2) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          uVar22 = (uint)uVar32;
          if ((uVar22 >> 0x13 & 1) == 0) {
            if (((uVar22 >> 0x15 & 1) == 0) ||
               (((uVar22 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar12 + 0xc) & 0x80) == 0)))) {
              if (((uVar22 >> 0x14 & 1) == 0) || (pZVar8->decoder_mode[3] == '\0'))
              goto LAB_00109da1;
              ZVar41 = uVar32 | 0x80000000;
            }
            else {
              ZVar41 = uVar32 | 0x100000000;
            }
          }
          else {
            ZVar41 = uVar32 | 0x40000000;
          }
          goto LAB_00109d9d;
        }
LAB_00109da1:
        bVar40 = (local_c0->prefixes).offset_group1;
        if (((((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[bVar40].type ==
             ZYDIS_PREFIX_TYPE_IGNORED) &&
           ((((ZydisDecodedInstruction *)pEVar36)->attributes & 0x3f0000000) != 0)) {
          (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[bVar40].type =
               ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if ((*(byte *)((long)puVar12 + 0xd) & 1) != 0) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x1000000;
          ZVar16 = (local_c0->prefixes).group2;
          uVar43 = local_48;
          if (ZVar16 != '.') {
            if (ZVar16 != '>') goto LAB_00109e1f;
            uVar43 = 0x801000000;
          }
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | uVar43;
          (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[(local_c0->prefixes).offset_group2].
          type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
LAB_00109e1f:
        if ((*(byte *)((long)puVar12 + 0xc) & 0x40) != 0) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x2000000;
          if ((pZVar8->decoder_mode[4] != '\0') &&
             (lVar39 = (long)(local_c0->prefixes).offset_notrack, -1 < lVar39)) {
            ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x1002000000;
            (((ZydisDecodedInstruction *)pEVar36)->raw).prefixes[lVar39].type =
                 ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
        }
        if (((*(byte *)((long)puVar12 + 0xb) & 0x20) != 0) &&
           ((*(byte *)((long)puVar12 + 0xd) & 1) == 0)) {
          uVar32 = ((ZydisDecodedInstruction *)pEVar36)->attributes;
          ((ZydisDecodedInstruction *)pEVar36)->attributes = uVar32 | 0x4000000;
          bVar40 = (local_c0->prefixes).effective_segment;
          if ((uVar32 >> 0x24 & 1) == 0 && bVar40 != 0) {
            if (bVar40 < 0x3e) {
              if (bVar40 == 0x26) goto LAB_00109ed9;
              uVar43 = 0x2004000000;
              if (bVar40 != 0x2e) {
                if (bVar40 != 0x36) {
LAB_0010b7d3:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x89d,
                                "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                               );
                }
                goto LAB_00109ecd;
              }
            }
            else {
              if (bVar40 != 0x3e) {
                if (bVar40 == 100) goto LAB_00109f01;
                if (bVar40 != 0x65) goto LAB_0010b7d3;
                goto LAB_00109b81;
              }
LAB_001099a9:
              uVar43 = 0x8004000000;
            }
            goto LAB_00109f0b;
          }
          goto LAB_00109f12;
        }
      }
      if (3 < ZVar4 - ZYDIS_INSTRUCTION_ENCODING_XOP) goto switchD_00109f5b_default;
      if (pZVar5 == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x8fa,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      switch(ZVar4 - ZYDIS_INSTRUCTION_ENCODING_XOP) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        uVar32 = (ulong)(pZVar5->vector_unified).LL;
        if (1 < uVar32) {
          __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x908,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        (((ZydisDecodedInstruction *)pEVar36)->avx).vector_length =
             *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_96 + uVar32 * 2);
        break;
      case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
        uVar32 = (ulong)(pZVar5->vector_unified).LL;
        if (1 < uVar32) {
          __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x914,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        (((ZydisDecodedInstruction *)pEVar36)->avx).vector_length =
             *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_96 + uVar32 * 2);
        if ((*(ushort *)((long)puVar12 + 0xc) & 0x1c0) != 0) {
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.is_static = '\x01';
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode =
               *(ZydisBroadcastMode *)
                (ZydisSetAVXInformation_broadcasts +
                (ulong)(*(ushort *)((long)puVar12 + 0xc) >> 6 & 7) * 4);
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        bVar40 = (pZVar5->vector_unified).LL;
        bVar46 = *(byte *)((long)puVar12 + 0xc) >> 6;
        bVar44 = bVar46 - 1;
        if (bVar46 == 0) {
          bVar44 = bVar40;
        }
        if (2 < bVar44) {
          __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x93d,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar32 = (ulong)bVar44;
        ZVar1 = *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_97 + uVar32 * 2);
        (((ZydisDecodedInstruction *)pEVar36)->avx).vector_length = ZVar1;
        (pZVar5->evex).tuple_type = *(byte *)((long)puVar12 + 0xd) & 0x1f;
        bVar46 = *(byte *)((long)puVar12 + 0xd);
        if ((bVar46 & 0x1f) == 0) {
          if ((((ZydisDecodedInstruction *)pEVar36)->raw).modrm.mod != '\x03') {
            __assert_fail("instruction->raw.modrm.mod == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa79,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          goto LAB_0010a765;
        }
        if ((((ZydisDecodedInstruction *)pEVar36)->raw).modrm.mod == '\x03') {
          __assert_fail("instruction->raw.modrm.mod != 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x943,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (bVar46 < 0x20) {
          __assert_fail("def->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x944,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (0xbf < bVar46) {
          __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x94b,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar50 = bVar46 >> 5;
        bVar14 = *(byte *)((long)&ZydisSetAVXInformation_element_sizes + (ulong)bVar50);
        (pZVar5->evex).element_size = bVar14;
        bVar49 = *(byte *)((long)puVar12 + 0xd);
        pEVar36 = (Elf64_Ehdr *)local_c8;
        switch(bVar49 & 0x1f) {
        case 1:
          uVar43 = (ulong)(local_c8->raw).evex.b;
          if (1 < uVar43) {
            __assert_fail("evex_b < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x954,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (uVar43 != 0) {
            bVar57 = (bVar46 & 0xc0) != 0x40;
            if ((pZVar5->vector_unified).W != '\0') {
              bVar57 = bVar50 != 4;
            }
            if (bVar57) {
              __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x957,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((*(ushort *)((long)puVar12 + 0xe) & 3) != 1) {
              __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x958,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
          }
          if (bVar50 == 5) {
            __assert_fail("size_index < 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x98e,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          pZVar5->cd8_scale =
               ZydisSetAVXInformation_scales[uVar32 + (ulong)(bVar14 >> 5) * 3 + uVar43 * 9];
          puVar45 = ZydisSetAVXInformation_broadcasts_104 +
                    (ulong)(bVar14 >> 5) * 0xc + uVar43 * 0x24;
          goto LAB_0010a652;
        case 2:
          uVar43 = (ulong)(local_c8->raw).evex.b;
          if (1 < uVar43) {
            __assert_fail("evex_b < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x997,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("!context->vector_unified.W",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x998,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((bVar46 & 0xc0) != 0x40) {
            __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x99a,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((uVar43 != 0) && ((*(ushort *)((long)puVar12 + 0xe) & 3) != 1)) {
            __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x99b,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar50 == 5) {
            __assert_fail("size_index < 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x9c5,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          lVar39 = (ulong)(bVar14 >> 5) * 3;
          pZVar5->cd8_scale = ZydisSetAVXInformation_scales_108[uVar32 + lVar39 + uVar43 * 6];
          puVar45 = ZydisSetAVXInformation_broadcasts_109 + uVar43 * 0x18;
          goto LAB_0010a64e;
        case 3:
          puVar42 = &ZydisSetAVXInformation_scales_110;
          break;
        case 4:
          goto switchD_0010a02c_caseD_4;
        case 5:
          if (bVar50 == 5) {
            __assert_fail("size_index < 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x9fa,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          ZVar16 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_120 + (ulong)(bVar14 >> 5));
          goto LAB_0010a75c;
        case 6:
          if (bVar50 != 3) {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa00,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("context->vector_unified.W == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa01,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
        case 0xe:
          pZVar5->cd8_scale = '\x10';
          goto LAB_0010a765;
        case 7:
          ZVar16 = (pZVar5->vector_unified).W;
          if (ZVar16 == '\x01') {
            if (bVar50 != 4) {
              __assert_fail("context->evex.element_size == 64",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x9db,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
          }
          else {
            if (ZVar16 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x9de,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (bVar50 != 3) {
              __assert_fail("context->evex.element_size == 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x9d8,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
          }
          goto switchD_0010a02c_caseD_4;
        case 8:
          ZVar16 = (pZVar5->vector_unified).W;
          if (ZVar16 == '\x01') {
            if (bVar50 != 4) {
              __assert_fail("context->evex.element_size == 64",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa0c,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((ZVar1 != 0x100) && (ZVar1 != 0x200)) {
              __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa0e,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
LAB_0010a88f:
            pZVar5->cd8_scale = '\x10';
          }
          else {
            if (ZVar16 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa12,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (bVar50 != 3) {
              __assert_fail("context->evex.element_size == 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa08,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            pZVar5->cd8_scale = '\b';
          }
          goto LAB_0010a765;
        case 9:
          ZVar16 = (pZVar5->vector_unified).W;
          if (ZVar16 != '\x01') {
            if (ZVar16 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa24,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if (bVar50 != 3) {
              __assert_fail("context->evex.element_size == 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa19,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            if ((ZVar1 != 0x100) && (ZVar1 != 0x200)) {
              __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xa1b,
                            "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            goto LAB_0010a88f;
          }
          if (bVar50 != 4) {
            __assert_fail("context->evex.element_size == 64",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa1f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar44 != 2) {
            __assert_fail("instruction->avx.vector_length == 512",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa20,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          goto LAB_0010a733;
        case 10:
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("!context->vector_unified.W",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa28,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar44 != 2) {
            __assert_fail("instruction->avx.vector_length == 512",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa29,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar50 != 3) {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa2a,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
LAB_0010a733:
          pZVar5->cd8_scale = ' ';
          goto LAB_0010a765;
        case 0xb:
          puVar42 = &ZydisSetAVXInformation_scales_118;
          break;
        case 0xc:
          puVar42 = &ZydisSetAVXInformation_scales_119;
          break;
        case 0xd:
          puVar42 = &ZydisSetAVXInformation_scales_120;
          break;
        case 0xf:
          puVar42 = &ZydisSetAVXInformation_scales_121;
          break;
        case 0x10:
          uVar43 = (ulong)(local_c8->raw).evex.b;
          if (1 < uVar43) {
            __assert_fail("evex_b < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa57,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((pZVar5->vector_unified).W != '\0') {
            __assert_fail("!context->vector_unified.W",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa58,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (bVar50 != 2) {
            __assert_fail("context->evex.element_size == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa59,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((uVar43 != 0) && ((*(ushort *)((long)puVar12 + 0xe) & 3) != 1)) {
            __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa5a,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          lVar39 = uVar43 * 3;
          pZVar5->cd8_scale =
               *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_123 + uVar32 + lVar39);
          puVar45 = ZydisSetAVXInformation_broadcasts_124;
LAB_0010a64e:
          puVar45 = puVar45 + lVar39 * 4;
LAB_0010a652:
          (local_c8->avx).broadcast.mode = *(ZydisBroadcastMode *)(puVar45 + uVar32 * 4);
          goto LAB_0010a765;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xa75,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        ZVar16 = *(ZyanU8 *)(uVar32 + (long)puVar42);
LAB_0010a75c:
        pZVar5->cd8_scale = ZVar16;
LAB_0010a765:
        if ((*(ushort *)((long)puVar12 + 0xe) & 0x780) != 0) {
          if ((((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode !=
              ZYDIS_BROADCAST_MODE_INVALID) {
            __assert_fail("!instruction->avx.broadcast.mode",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa7f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.is_static = '\x01';
          uVar22 = *(ushort *)((long)puVar12 + 0xe) >> 7 & 0xf;
          if (0xc < (ushort)uVar22) {
            __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xa91,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode =
               *(ZydisBroadcastMode *)(ZydisSetAVXInformation_broadcasts_127 + (ulong)uVar22 * 4);
        }
        if (((((ZydisDecodedInstruction *)pEVar36)->raw).evex.b != '\0') &&
           (uVar17 = *(ushort *)((long)puVar12 + 0xe) & 3, 1 < uVar17)) {
          if (uVar17 != 3) {
            (((ZydisDecodedInstruction *)pEVar36)->avx).rounding.mode =
                 bVar40 + ZYDIS_ROUNDING_MODE_RN;
          }
          (((ZydisDecodedInstruction *)pEVar36)->avx).has_sae = '\x01';
        }
        bVar40 = (((ZydisDecodedInstruction *)pEVar36)->raw).evex.aaa;
        (((ZydisDecodedInstruction *)pEVar36)->avx).mask.reg = bVar40 + ZYDIS_REGISTER_K0;
        switch(*(ushort *)((long)puVar12 + 0xe) >> 5 & 3) {
        case 0:
          iVar30 = 2;
          break;
        case 1:
          ZVar20 = ZYDIS_MASK_MODE_REQUIRED_BITS;
          goto LAB_0010a809;
        case 2:
          iVar30 = 4;
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xab7,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        ZVar20 = (uint)(((ZydisDecodedInstruction *)pEVar36)->raw).evex.z + iVar30;
LAB_0010a809:
        if (bVar40 == 0) {
          ZVar20 = ZYDIS_MASK_MODE_DISABLED;
        }
        (((ZydisDecodedInstruction *)pEVar36)->avx).mask.mode = ZVar20;
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        (((ZydisDecodedInstruction *)pEVar36)->avx).vector_length = 0x200;
        uVar9 = *(uint3 *)((long)puVar12 + 0xc);
        if ((uVar9 & 0x1c000) != 0 && (uVar9 & 0x2000) != 0) {
          __assert_fail("!index || !def->broadcast",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xacd,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar22 = uVar9 >> 0xd & 1;
        uVar32 = (ulong)uVar22;
        bVar57 = true;
        if ((char)uVar22 != '\0' || (uVar9 & 0x1c000) == 0) goto LAB_0010a1da;
        (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.is_static = '\x01';
        switch(*(uint3 *)((long)puVar12 + 0xc) >> 0xe & 7) {
        case 1:
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
          break;
        case 2:
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
          break;
        case 3:
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
          goto LAB_0010a1c5;
        case 4:
          (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
LAB_0010a1c5:
          uVar32 = 2;
          bVar57 = false;
          goto LAB_0010a1da;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xae4,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar32 = 1;
LAB_0010a1da:
        switch(*(ushort *)((long)puVar12 + 0xc) >> 6 & 0x1f) {
        case 0:
        case 1:
        case 2:
        case 3:
        case 8:
        case 9:
          goto switchD_0010a1fb_caseD_0;
        case 4:
        case 5:
        case 6:
        case 7:
          ZVar16 = '@';
          goto LAB_0010a31d;
        case 10:
        case 0xb:
        case 0xc:
        case 0x12:
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS;
          if (7 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb04,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          puVar45 = ZydisSetAVXInformation_lookup_130;
          break;
        case 0xd:
        case 0x11:
        case 0x13:
        case 0x15:
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS;
          if (2 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb22,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          pZVar33 = ZydisSetAVXInformation_lookup_133 + uVar32 * 3 + uVar43;
          goto LAB_0010a31b;
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x14:
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS;
          if (7 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb13,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          puVar45 = ZydisSetAVXInformation_lookup_132;
          break;
        case 0x16:
        case 0x18:
          if (!bVar57) {
            __assert_fail("index < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb2e,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          uVar43 = (ulong)(((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS;
          if (7 < uVar43) {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb2f,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          puVar45 = ZydisSetAVXInformation_lookup_134;
          break;
        case 0x17:
        case 0x19:
          if (!bVar57) {
            __assert_fail("index < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb3b,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS != '\0') {
            __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb3c,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          pZVar33 = (ZyanU8 *)((long)&ZydisSetAVXInformation_lookup_136 + uVar32);
          goto LAB_0010a31b;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xb41,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        pZVar33 = puVar45 + uVar43 + uVar32 * 8;
LAB_0010a31b:
        ZVar16 = *pZVar33;
LAB_0010a31d:
        pZVar5->cd8_scale = ZVar16;
switchD_0010a1fb_caseD_0:
        (pZVar5->mvex).functionality = (byte)(*(ushort *)((long)puVar12 + 0xc) >> 6) & 0x1f;
        switch(*(ushort *)((long)puVar12 + 0xc) >> 6 & 0x1f) {
        case 0:
        case 1:
        case 4:
        case 5:
        case 6:
        case 7:
        case 0x13:
        case 0x15:
        case 0x17:
        case 0x19:
          break;
        case 2:
          (((ZydisDecodedInstruction *)pEVar36)->avx).rounding.mode =
               ((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS & 3) + ZYDIS_ROUNDING_MODE_RN;
        case 3:
          if (3 < (((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS) {
            (((ZydisDecodedInstruction *)pEVar36)->avx).has_sae = '\x01';
          }
          break;
        case 8:
        case 9:
          (((ZydisDecodedInstruction *)pEVar36)->avx).swizzle.mode =
               (((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS + ZYDIS_SWIZZLE_MODE_DCBA;
          break;
        case 10:
        case 0xb:
        case 0xc:
          switch((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS) {
          case '\0':
            break;
          case '\x01':
switchD_0010a3c1_caseD_1:
            (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode =
                 ZYDIS_BROADCAST_MODE_1_TO_16;
            break;
          case '\x02':
switchD_0010a3c1_caseD_2:
            (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode =
                 ZYDIS_BROADCAST_MODE_4_TO_16;
            break;
          case '\x03':
switchD_0010a424_caseD_3:
            (((ZydisDecodedInstruction *)pEVar36)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_FLOAT16;
            break;
          case '\x04':
switchD_0010a451_caseD_4:
            (((ZydisDecodedInstruction *)pEVar36)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
            break;
          case '\x05':
switchD_0010a451_caseD_5:
            (((ZydisDecodedInstruction *)pEVar36)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_SINT8;
            break;
          case '\x06':
switchD_0010a451_caseD_6:
            (((ZydisDecodedInstruction *)pEVar36)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_MAX_VALUE;
            break;
          case '\a':
switchD_0010a451_caseD_7:
            (((ZydisDecodedInstruction *)pEVar36)->avx).conversion.mode =
                 ZYDIS_CONVERSION_MODE_SINT16;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb7a,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          break;
        case 0xd:
        case 0x11:
          ZVar16 = (((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS;
          if (ZVar16 != '\0') {
            if (ZVar16 == '\x02') {
              (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode =
                   ZYDIS_BROADCAST_MODE_4_TO_8;
            }
            else {
              if (ZVar16 != '\x01') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                              ,0xba7,
                              "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                             );
              }
              (((ZydisDecodedInstruction *)pEVar36)->avx).broadcast.mode =
                   ZYDIS_BROADCAST_MODE_1_TO_8;
            }
          }
          break;
        case 0xe:
        case 0xf:
        case 0x10:
          switch((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS) {
          case '\0':
            break;
          case '\x01':
            goto switchD_0010a3c1_caseD_1;
          case '\x02':
            goto switchD_0010a3c1_caseD_2;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xb97,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          case '\x04':
            goto switchD_0010a451_caseD_4;
          case '\x05':
            goto switchD_0010a451_caseD_5;
          case '\x06':
            goto switchD_0010a451_caseD_6;
          case '\a':
            goto switchD_0010a451_caseD_7;
          }
        case 0x12:
        case 0x16:
          switch((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS) {
          case '\0':
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xbc0,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          case '\x03':
            goto switchD_0010a424_caseD_3;
          case '\x04':
            goto switchD_0010a451_caseD_4;
          case '\x05':
            goto switchD_0010a451_caseD_5;
          case '\x06':
            goto switchD_0010a451_caseD_6;
          case '\a':
            goto switchD_0010a451_caseD_7;
          }
        case 0x14:
        case 0x18:
          switch((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.SSS) {
          case '\0':
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xbd9,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          case '\x04':
            goto switchD_0010a451_caseD_4;
          case '\x05':
            goto switchD_0010a451_caseD_5;
          case '\x06':
            goto switchD_0010a451_caseD_6;
          case '\a':
            goto switchD_0010a451_caseD_7;
          }
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xbe0,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (((((ZydisDecodedInstruction *)pEVar36)->raw).modrm.mod != '\x03') &&
           ((((ZydisDecodedInstruction *)pEVar36)->raw).mvex.E != '\0')) {
          (((ZydisDecodedInstruction *)pEVar36)->avx).has_eviction_hint = '\x01';
        }
        (((ZydisDecodedInstruction *)pEVar36)->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
        (((ZydisDecodedInstruction *)pEVar36)->avx).mask.reg =
             (((ZydisDecodedInstruction *)pEVar36)->raw).mvex.kkk + ZYDIS_REGISTER_K0;
      }
switchD_00109f5b_default:
      ZVar15 = ZydisGetAccessedFlags
                         ((ZydisInstructionDefinition *)
                          CONCAT44(local_b0._4_4_,
                                   CONCAT13(local_b0._3_1_,
                                            CONCAT12(local_b0._2_1_,
                                                     CONCAT11(local_b0._1_1_,(byte)local_b0)))),
                          &local_40);
      if (ZVar15 != '\0') {
        pbVar6 = (byte *)((long)&((ZydisDecodedInstruction *)pEVar36)->attributes + 1);
        *pbVar6 = *pbVar6 | 2;
        ((ZydisDecodedInstruction *)pEVar36)->cpu_flags = &local_40->cpu_flags;
        ((ZydisDecodedInstruction *)pEVar36)->fpu_flags = &local_40->fpu_flags;
      }
      goto LAB_0010a844;
    }
    pEVar54 = &Elf64_Ehdr_00100000;
    pZVar27 = pZVar24;
LAB_00108cd3:
    unaff_R12 = (Elf64_Ehdr *)((ulong)unaff_R12 & 0xffffffff);
    if ((int)pEVar54 < 0) {
LAB_0010a844:
      iVar30 = 1;
      unaff_R12 = pEVar54;
    }
    else {
      node = ZydisDecoderTreeGetChildNode(node,local_cc);
      iVar30 = 0;
    }
LAB_0010a84c:
    if ((iVar30 != 3) && (iVar30 != 0)) {
      return (ZyanStatus)unaff_R12;
    }
    pZVar24 = pZVar27;
    if ((char)ZVar55 < '\x01') {
      return 0x100000;
    }
  } while( true );
switchD_0010a02c_caseD_4:
  if (0xbf < bVar49) {
    __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x9ec,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar16 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_113 + (ulong)(bVar49 >> 5));
  goto LAB_0010a75c;
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_AMD_BRANCHES] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_KNC] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_MPX] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_CET] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_LZCNT] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_TZCNT] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_WBNOINVD] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_CLDEMOTE] ? 1 : 0;
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!state->decoder->decoder_mode[ZYDIS_DECODER_MODE_MINIMAL])
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                        instruction->cpu_flags = &flags->cpu_flags;
                        instruction->fpu_flags = &flags->fpu_flags;
                    }
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}